

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_39::NameComponents::NameComponents(NameComponents *this,NameSyntax *name)

{
  Token id;
  Token id_00;
  Token id_01;
  Token id_02;
  Token id_03;
  ClassNameSyntax *pCVar1;
  ParameterValueAssignmentSyntax *pPVar2;
  SyntaxNode *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ClassNameSyntax *cn;
  IdentifierSelectNameSyntax *idSelect;
  undefined4 in_stack_ffffffffffffff78;
  SyntaxKind SVar3;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff80;
  NameComponents *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  size_t local_58;
  char *local_50;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI);
  SourceRange::SourceRange((SourceRange *)in_RDI);
  std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
             0x711305);
  in_RDI[3]._M_len = 0;
  SVar3 = in_RSI->kind;
  if ((1 < SVar3 - ArrayAndMethod) && (1 < SVar3 - ArrayUniqueMethod)) {
    if (SVar3 == ClassName) {
      pCVar1 = slang::syntax::SyntaxNode::as<slang::syntax::ClassNameSyntax>(in_RSI);
      id_02.info = (Info *)pCVar1;
      id_02._0_8_ = (pCVar1->identifier).info;
      set(*(NameComponents **)&pCVar1->identifier,id_02);
      pPVar2 = not_null::operator_cast_to_ParameterValueAssignmentSyntax_
                         ((not_null<slang::syntax::ParameterValueAssignmentSyntax_*> *)0x7114ff);
      in_RDI[3]._M_len = (size_t)pPVar2;
      return;
    }
    if (SVar3 != ConstructorName) {
      if (SVar3 == IdentifierName) {
        slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(in_RSI);
        id.info = in_stack_ffffffffffffffa0;
        id.kind = (short)in_stack_ffffffffffffff98;
        id._2_1_ = (char)((ulong)in_stack_ffffffffffffff98 >> 0x10);
        id.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff98 >> 0x18);
        id.rawLen = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        set(in_stack_ffffffffffffff90,id);
        return;
      }
      if (SVar3 == IdentifierSelectName) {
        slang::syntax::SyntaxNode::as<slang::syntax::IdentifierSelectNameSyntax>(in_RSI);
        id_01.info = in_stack_ffffffffffffffa0;
        id_01.kind = (short)in_stack_ffffffffffffff98;
        id_01._2_1_ = (char)((ulong)in_stack_ffffffffffffff98 >> 0x10);
        id_01.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff98 >> 0x18);
        id_01.rawLen = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        set(in_stack_ffffffffffffff90,id_01);
        std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>_&>
                  (in_stack_ffffffffffffff80,
                   (SyntaxList<slang::syntax::ElementSelectSyntax> *)
                   CONCAT44(SVar3,in_stack_ffffffffffffff78));
        in_RDI[2]._M_len = local_58;
        in_RDI[2]._M_str = local_50;
        return;
      }
      if ((((SVar3 != LocalScope) && (SVar3 != RootScope)) && (SVar3 != SuperHandle)) &&
         (SVar3 == SystemName)) {
        slang::syntax::SyntaxNode::as<slang::syntax::SystemNameSyntax>(in_RSI);
        id_00.info = in_stack_ffffffffffffffa0;
        id_00.kind = (short)in_stack_ffffffffffffff98;
        id_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff98 >> 0x10);
        id_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff98 >> 0x18);
        id_00.rawLen = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        set(in_stack_ffffffffffffff90,id_00);
        return;
      }
    }
  }
  slang::syntax::SyntaxNode::as<slang::syntax::KeywordNameSyntax>(in_RSI);
  id_03.info = in_stack_ffffffffffffffa0;
  id_03.kind = (short)in_stack_ffffffffffffff98;
  id_03._2_1_ = (char)((ulong)in_stack_ffffffffffffff98 >> 0x10);
  id_03.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff98 >> 0x18);
  id_03.rawLen = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  set(in_stack_ffffffffffffff90,id_03);
  return;
}

Assistant:

NameComponents(const NameSyntax& name) {
        switch (name.kind) {
            case SyntaxKind::IdentifierName:
                set(name.as<IdentifierNameSyntax>().identifier);
                break;
            case SyntaxKind::SystemName:
                set(name.as<SystemNameSyntax>().systemIdentifier);
                break;
            case SyntaxKind::IdentifierSelectName: {
                auto& idSelect = name.as<IdentifierSelectNameSyntax>();
                set(idSelect.identifier);
                selectors = idSelect.selectors;
                break;
            }
            case SyntaxKind::ClassName: {
                auto& cn = name.as<ClassNameSyntax>();
                set(cn.identifier);
                paramAssignments = cn.parameters;
                break;
            }
            case SyntaxKind::UnitScope:
            case SyntaxKind::RootScope:
            case SyntaxKind::LocalScope:
            case SyntaxKind::ThisHandle:
            case SyntaxKind::SuperHandle:
            case SyntaxKind::ArrayUniqueMethod:
            case SyntaxKind::ArrayAndMethod:
            case SyntaxKind::ArrayOrMethod:
            case SyntaxKind::ArrayXorMethod:
            case SyntaxKind::ConstructorName:
                set(name.as<KeywordNameSyntax>().keyword);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }